

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckArray2DCloseDoesNotHaveSideEffectsWhenFailing::
TestCheckArray2DCloseDoesNotHaveSideEffectsWhenFailing
          (TestCheckArray2DCloseDoesNotHaveSideEffectsWhenFailing *this)

{
  char *suiteName;
  TestCheckArray2DCloseDoesNotHaveSideEffectsWhenFailing *this_local;
  
  suiteName = UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"CheckArray2DCloseDoesNotHaveSideEffectsWhenFailing",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/UnitTest++/src/tests/TestCheckMacros.cpp"
             ,0x314);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__TestCheckArray2DCloseDoesNotHaveSideEffectsWhenFailing_001837d0;
  return;
}

Assistant:

TEST(CheckArray2DCloseDoesNotHaveSideEffectsWhenFailing)
{
    g_sideEffect = 0;
    {
        UnitTest::TestResults testResults;
		ScopedCurrentTest scopedResults(testResults);

		const float data[2][2] = { {0, 1}, {3, 3} };
        CHECK_ARRAY2D_CLOSE (data, FunctionWithSideEffects3(), 2, 2, 0.01f);
    }
    CHECK_EQUAL(1, g_sideEffect);
}